

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall BenevolentBotStrategy::intInput(BenevolentBotStrategy *this,StrategyContext context)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = -1;
  switch(context) {
  case DEFEND_DICE_COUNT:
    iVar1 = (1 < *((this->super_PlayerStrategy).to)->pNumberOfTroops) + 1;
    break;
  case FORTIFY_FROM_COUNTRY:
    iVar1 = fortifyFromCountryIndex(this);
    break;
  case FORTIFY_TO_COUNTRY:
    iVar1 = fortifyToCountryIndex(this);
    break;
  case FORTIFY_ARMY_COUNT:
    iVar1 = fortifyArmyCount(this);
    break;
  case REINFORCE_CARD_COUNT:
    iVar1 = numArmies(this);
    break;
  case REINFORCE_ARMY_COUNT:
    iVar1 = place(this);
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return iVar1;
}

Assistant:

int BenevolentBotStrategy::intInput(StrategyContext context) {
    int count = 0;

    switch ((int) context) {
        case StrategyContext::DEFEND_DICE_COUNT:
            count = defendNumDice();
            break;
        case StrategyContext::FORTIFY_FROM_COUNTRY:
            count = fortifyFromCountryIndex();
            break;
        case StrategyContext::FORTIFY_TO_COUNTRY:
            count = fortifyToCountryIndex();
            break;
        case StrategyContext::FORTIFY_ARMY_COUNT:
            count = fortifyArmyCount();
            break;
        case StrategyContext::REINFORCE_ARMY_COUNT:
            count = place();
            break;
        case StrategyContext::REINFORCE_CARD_COUNT:
            count = numArmies();
            break;
        case StrategyContext::ATTACK_FROM_COUNTRY:
        case StrategyContext::ATTACK_TO_COUNTRY:
        case StrategyContext::ATTACK_DICE_COUNT:
        case StrategyContext::ATTACK_NEW_ARMY_COUNT:
        default: {
            count = -1;
        }
    }
    std::cout << count << std::endl;
    return count;
}